

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O1

long __thiscall
mkvparser::Chapters::Display::Parse(Display *this,IMkvReader *pReader,longlong pos,longlong size)

{
  long stop;
  bool bVar1;
  long lVar2;
  long lVar3;
  Display *str;
  long unaff_R15;
  longlong size_1;
  longlong id;
  longlong local_60;
  Display *local_58;
  Display *local_50;
  Display *local_48;
  long local_40;
  long local_38;
  
  stop = size + pos;
  if (0 < size) {
    local_48 = (Display *)&this->m_country;
    local_50 = (Display *)&this->m_language;
    local_60 = pos;
    local_58 = this;
    do {
      lVar3 = ParseElementHeader(pReader,&local_60,stop,&local_38,&local_40);
      lVar2 = local_40;
      bVar1 = true;
      if (-1 < lVar3) {
        if (local_40 == 0) {
          bVar1 = false;
          lVar3 = unaff_R15;
        }
        else {
          str = local_48;
          if ((((local_38 != 0x437e) && (str = local_50, local_38 != 0x437c)) &&
              (str = local_58, local_38 != 0x85)) ||
             (lVar3 = UnserializeString(pReader,local_60,local_40,&str->m_string), lVar3 == 0)) {
            local_60 = lVar2 + local_60;
            bVar1 = stop < local_60;
            lVar3 = unaff_R15;
            if (stop < local_60) {
              lVar3 = -2;
            }
          }
        }
      }
      if (bVar1) {
        return lVar3;
      }
      pos = local_60;
      unaff_R15 = lVar3;
    } while (local_60 < stop);
  }
  return (ulong)(pos == stop) * 2 + -2;
}

Assistant:

long Chapters::Display::Parse(IMkvReader* pReader, long long pos,
                              long long size) {
  const long long stop = pos + size;

  while (pos < stop) {
    long long id, size;

    long status = ParseElementHeader(pReader, pos, stop, id, size);

    if (status < 0)  // error
      return status;

    if (size == 0)  // No payload.
      continue;

    if (id == libwebm::kMkvChapString) {
      status = UnserializeString(pReader, pos, size, m_string);

      if (status)
        return status;
    } else if (id == libwebm::kMkvChapLanguage) {
      status = UnserializeString(pReader, pos, size, m_language);

      if (status)
        return status;
    } else if (id == libwebm::kMkvChapCountry) {
      status = UnserializeString(pReader, pos, size, m_country);

      if (status)
        return status;
    }

    pos += size;
    if (pos > stop)
      return E_FILE_FORMAT_INVALID;
  }

  if (pos != stop)
    return E_FILE_FORMAT_INVALID;
  return 0;
}